

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Numeric.hpp
# Opt level: O2

Gen<int> * rc::gen::inRange<int>(Gen<int> *__return_storage_ptr__,int min,int max)

{
  anon_class_8_2_43e47753 local_10;
  
  local_10.max = max;
  local_10.min = min;
  Gen<int>::Gen<rc::gen::inRange<int>(int,int)::_lambda(rc::Random_const&,int)_1_,void>
            (__return_storage_ptr__,&local_10);
  return __return_storage_ptr__;
}

Assistant:

Gen<T> inRange(T min, T max) {
  return [=](const Random &random, int size) {
    if (max <= min) {
      std::string msg;
      msg += "Invalid range [" + std::to_string(min);
      msg += ", " + std::to_string(max) + ")";
      throw GenerationFailure(msg);
    }

    const auto rangeSize =
        detail::scaleInteger(static_cast<Random::Number>(max) -
                                 static_cast<Random::Number>(min) - 1,
                             size) +
        1;
    const auto value =
        static_cast<T>((Random(random).next() % rangeSize) + min);
    assert(value >= min && value < max);
    return shrinkable::shrinkRecur(
        value, [=](T x) { return shrink::towards<T>(x, min); });
  };
}